

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError str2udouble(double *valp,char *str,long max)

{
  double dStack_30;
  ParameterError result;
  double value;
  long max_local;
  char *str_local;
  double *valp_local;
  
  value = (double)max;
  max_local = (long)str;
  str_local = (char *)valp;
  valp_local._4_4_ = str2double(&stack0xffffffffffffffd0,str,max);
  if (valp_local._4_4_ == PARAM_OK) {
    if (0.0 <= dStack_30) {
      *(double *)str_local = dStack_30;
      valp_local._4_4_ = PARAM_OK;
    }
    else {
      valp_local._4_4_ = PARAM_NEGATIVE_NUMERIC;
    }
  }
  return valp_local._4_4_;
}

Assistant:

ParameterError str2udouble(double *valp, const char *str, long max)
{
  double value;
  ParameterError result = str2double(&value, str, max);
  if(result != PARAM_OK)
    return result;
  if(value < 0)
    return PARAM_NEGATIVE_NUMERIC;

  *valp = value;
  return PARAM_OK;
}